

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O0

void __thiscall QToolBoxPrivate::_q_widgetDestroyed(QToolBoxPrivate *this,QObject *object)

{
  long lVar1;
  __normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
  __last;
  bool bVar2;
  __normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
  __first;
  iterator iVar3;
  QToolBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  byte bVar4;
  bool removeCurrent;
  Page *c;
  QToolBox *q;
  PageList *__i;
  int _t1;
  QToolBoxButton *this_00;
  QWidget *in_stack_ffffffffffffff90;
  QLayout *in_stack_ffffffffffffff98;
  QToolBoxPrivate *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffb0;
  const_iterator __last_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __last_00._M_current =
       (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)in_RDI;
  q_func(in_RDI);
  __first._M_current =
       (unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *)
       page(in_stack_ffffffffffffffa0,&in_stack_ffffffffffffff98->super_QObject);
  if ((Page *)__first._M_current != (Page *)0x0) {
    QLayout::removeWidget(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    QLayout::removeWidget(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    QObject::deleteLater();
    this_00 = ((Page *)__first._M_current)->button;
    if (this_00 != (QToolBoxButton *)0x0) {
      (**(code **)(*(long *)&(this_00->super_QAbstractButton).super_QWidget + 0x20))();
    }
    bVar4 = (Page *)__first._M_current == in_RDI->currentPage;
    __i = &in_RDI->pageList;
    iVar3 = std::
            vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
            ::begin((vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                     *)this_00);
    std::
    vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
    ::end((vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
           *)this_00);
    ::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&pageEquals,(Page *)__first._M_current);
    __last._M_current._7_1_ = bVar4;
    __last._M_current._0_7_ = in_stack_ffffffffffffffb0;
    std::operator()(__first,__last,(anon_class_8_1_89900f8d_for__M_pred)iVar3._M_current);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,std::default_delete<QToolBoxPrivate::Page>>const*,std::vector<std::unique_ptr<QToolBoxPrivate::Page,std::default_delete<QToolBoxPrivate::Page>>,std::allocator<std::unique_ptr<QToolBoxPrivate::Page,std::default_delete<QToolBoxPrivate::Page>>>>>
    ::
    __normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,std::default_delete<QToolBoxPrivate::Page>>*>
              ((__normal_iterator<const_std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
                *)this_00,
               (__normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
                *)__i);
    iVar3 = std::
            vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
            ::end((vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                   *)this_00);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,std::default_delete<QToolBoxPrivate::Page>>const*,std::vector<std::unique_ptr<QToolBoxPrivate::Page,std::default_delete<QToolBoxPrivate::Page>>,std::allocator<std::unique_ptr<QToolBoxPrivate::Page,std::default_delete<QToolBoxPrivate::Page>>>>>
    ::
    __normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,std::default_delete<QToolBoxPrivate::Page>>*>
              ((__normal_iterator<const_std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
                *)this_00,
               (__normal_iterator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_*,_std::vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>_>
                *)__i);
    _t1 = (int)((ulong)__i >> 0x20);
    iVar3 = std::
            vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
            ::erase((vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                     *)CONCAT17(bVar4,in_stack_ffffffffffffffb0),(const_iterator)iVar3._M_current,
                    __last_00);
    bVar2 = std::
            vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
            ::empty((vector<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                     *)in_RDI);
    if (bVar2) {
      in_RDI->currentPage = (Page *)0x0;
      QToolBox::currentChanged((QToolBox *)0x703cd9,_t1);
    }
    else if ((bVar4 & 1) != 0) {
      in_RDI->currentPage = (Page *)0x0;
      QToolBox::setCurrentIndex((QToolBox *)iVar3._M_current,(int)((ulong)in_RDI >> 0x20));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolBoxPrivate::_q_widgetDestroyed(QObject *object)
{
    Q_Q(QToolBox);

    const QToolBoxPrivate::Page * const c = page(object);
    if (!c)
        return;

    layout->removeWidget(c->sv);
    layout->removeWidget(c->button);
    c->sv->deleteLater(); // page might still be a child of sv
    delete c->button;

    bool removeCurrent = c == currentPage;
    pageList.erase(std::remove_if(pageList.begin(), pageList.end(), pageEquals(c)), pageList.end());

    if (pageList.empty()) {
        currentPage = nullptr;
        emit q->currentChanged(-1);
    } else if (removeCurrent) {
        currentPage = nullptr;
        q->setCurrentIndex(0);
    }
}